

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1fc67bb::
BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int),_unsigned_char,_unsigned_char>
::RunTest(BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int),_unsigned_char,_unsigned_char>
          *this,int block_size,int run_times)

{
  internal iVar1;
  undefined8 *puVar2;
  ACMRandom *this_00;
  uint32_t uVar3;
  int iVar4;
  uchar *puVar5;
  int iVar6;
  uchar *puVar7;
  uint uVar8;
  SEARCH_METHODS *pSVar9;
  int iVar10;
  AssertHelper local_90;
  uint local_84;
  internal local_80;
  undefined7 uStack_7f;
  undefined8 *local_78;
  uint local_70;
  uint local_6c;
  uchar *local_68;
  uchar *local_60;
  uchar *local_58;
  AssertHelper local_50;
  uint local_48;
  int local_44;
  ACMRandom *local_40;
  uchar *local_38;
  
  local_70 = (uint)::block_size_wide[block_size];
  local_48 = (uint)::block_size_high[block_size];
  local_40 = &(this->
              super_FunctionEquivalenceTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int)>
              ).rng_;
  local_60 = this->src0_;
  local_68 = this->src1_;
  local_38 = this->dst_ref_;
  local_58 = this->dst_tst_;
  this->subx_ = 0;
  local_6c = run_times;
  do {
    this->suby_ = 0;
    iVar10 = 0;
    do {
      local_44 = this->subx_;
      this->w_ = local_70;
      this->h_ = local_48;
      local_84 = 1;
      if (1 < (int)local_6c) {
        local_84 = local_6c / local_70;
      }
      local_90.data_._0_4_ = 0;
      testing::internal::CmpHelperGT<int,int>
                (&local_80,"run_times","0",(int *)&local_84,(int *)&local_90);
      iVar1 = local_80;
      if (local_80 == (internal)0x0) {
        testing::Message::Message((Message *)&local_90);
        pSVar9 = "";
        if (local_78 != (undefined8 *)0x0) {
          pSVar9 = (SEARCH_METHODS *)*local_78;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/blend_a64_mask_test.cc"
                   ,0x59,(char *)pSVar9);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if ((long *)CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) + 8))();
        }
      }
      puVar2 = local_78;
      if (local_78 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_78 != local_78 + 2) {
          operator_delete((undefined8 *)*local_78);
        }
        operator_delete(puVar2);
      }
      this_00 = local_40;
      if (iVar1 != (internal)0x0) {
        this->subx_ = local_44;
        this->suby_ = iVar10;
        uVar3 = testing::internal::Random::Generate(&local_40->random_,0x21);
        this->dst_offset_ = uVar3;
        uVar3 = testing::internal::Random::Generate(&this_00->random_,0x281 - this->w_);
        this->dst_stride_ = uVar3 + this->w_;
        uVar3 = testing::internal::Random::Generate(&this_00->random_,0x21);
        this->src0_offset_ = uVar3;
        uVar3 = testing::internal::Random::Generate(&this_00->random_,0x281 - this->w_);
        this->src0_stride_ = uVar3 + this->w_;
        uVar3 = testing::internal::Random::Generate(&this_00->random_,0x21);
        this->src1_offset_ = uVar3;
        uVar3 = testing::internal::Random::Generate(&this_00->random_,0x281 - this->w_);
        this->src1_stride_ = uVar3 + this->w_;
        uVar3 = testing::internal::Random::Generate
                          (&this_00->random_,0x281 - (this->w_ << (this->subx_ != 0)));
        this->mask_stride_ = (long)(int)((this->w_ << (this->subx_ != 0)) + uVar3);
        puVar5 = local_68;
        puVar7 = local_60;
        if (((int)local_84 < 2) &&
           (uVar3 = testing::internal::Random::Generate(&local_40->random_,3), puVar5 = local_68,
           puVar7 = local_60, uVar3 != 0)) {
          if (uVar3 == 2) {
            this->src1_stride_ = this->dst_stride_;
            this->src1_offset_ = this->dst_offset_;
            puVar5 = local_58;
          }
          else if (uVar3 == 1) {
            this->src0_stride_ = this->dst_stride_;
            this->src0_offset_ = this->dst_offset_;
            puVar7 = local_58;
          }
          else {
            testing::Message::Message((Message *)&local_80);
            testing::internal::AssertHelper::AssertHelper
                      (&local_90,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/blend_a64_mask_test.cc"
                       ,0x49,"Failed");
            testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_80);
            testing::internal::AssertHelper::~AssertHelper(&local_90);
            puVar5 = local_68;
            puVar7 = local_60;
            if ((long *)CONCAT71(uStack_7f,local_80) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(uStack_7f,local_80) + 8))();
              puVar5 = local_68;
              puVar7 = local_60;
            }
          }
        }
        (*(this->
          super_FunctionEquivalenceTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int)>
          ).
          super_TestWithParam<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int)>_>
          .super_Test._vptr_Test[6])(this,puVar7,puVar5,(ulong)local_84);
        iVar10 = this->h_;
        if (0 < iVar10) {
          iVar4 = this->w_;
          iVar6 = 0;
          do {
            if (0 < iVar4) {
              iVar10 = 0;
              do {
                uVar8 = this->dst_stride_ * iVar6 + this->dst_offset_ + iVar10;
                testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
                          (&local_80,"dst_ref_[dst_offset_ + r * dst_stride_ + c]",
                           "dst_tst_[dst_offset_ + r * dst_stride_ + c]",local_38 + uVar8,
                           local_58 + uVar8);
                puVar2 = local_78;
                if (local_80 == (internal)0x0) {
                  testing::Message::Message((Message *)&local_90);
                  std::ostream::operator<<
                            ((void *)(CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) + 0x10),
                             this->w_);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) + 0x10)
                             ,"x",1);
                  std::ostream::operator<<
                            ((void *)(CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) + 0x10),
                             this->h_);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) + 0x10)
                             ," subx ",6);
                  std::ostream::operator<<
                            ((void *)(CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) + 0x10),
                             this->subx_);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) + 0x10)
                             ," suby ",6);
                  std::ostream::operator<<
                            ((void *)(CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) + 0x10),
                             this->suby_);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) + 0x10)
                             ," r: ",4);
                  std::ostream::operator<<
                            ((void *)(CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) + 0x10),
                             iVar6);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) + 0x10)
                             ," c: ",4);
                  std::ostream::operator<<
                            ((void *)(CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) + 0x10),
                             iVar10);
                  pSVar9 = "";
                  if (local_78 != (undefined8 *)0x0) {
                    pSVar9 = (SEARCH_METHODS *)*local_78;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_50,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/blend_a64_mask_test.cc"
                             ,0x76,(char *)pSVar9);
                  testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_90);
                  testing::internal::AssertHelper::~AssertHelper(&local_50);
                  if ((long *)CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) != (long *)0x0) {
                    (**(code **)(*(long *)CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) + 8))
                              ();
                  }
                  puVar2 = local_78;
                  if (local_78 != (undefined8 *)0x0) {
                    if ((undefined8 *)*local_78 != local_78 + 2) {
                      operator_delete((undefined8 *)*local_78);
                    }
                    operator_delete(puVar2);
                  }
                  goto LAB_006fca2c;
                }
                if (local_78 != (undefined8 *)0x0) {
                  if ((undefined8 *)*local_78 != local_78 + 2) {
                    operator_delete((undefined8 *)*local_78);
                  }
                  operator_delete(puVar2);
                }
                iVar10 = iVar10 + 1;
                iVar4 = this->w_;
              } while (iVar10 < iVar4);
              iVar10 = this->h_;
            }
            iVar6 = iVar6 + 1;
          } while (iVar6 < iVar10);
        }
      }
LAB_006fca2c:
      iVar4 = this->suby_;
      iVar10 = iVar4 + 1;
      this->suby_ = iVar10;
    } while (iVar4 < 1);
    iVar10 = this->subx_;
    this->subx_ = iVar10 + 1;
    if (0 < iVar10) {
      return;
    }
  } while( true );
}

Assistant:

void RunTest(int block_size, int run_times) {
    for (subx_ = 0; subx_ <= 1; subx_++) {
      for (suby_ = 0; suby_ <= 1; suby_++) {
        RunOneTest(block_size, subx_, suby_, run_times);
      }
    }
  }